

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3map_io.c
# Opt level: O1

int s3map_write(char *fn,void *map,uint32 n_dom,uint32 n_rng,size_t map_elem_size)

{
  int32 iVar1;
  int iVar2;
  FILE *fp;
  uint32 chksum;
  uint32 ignore;
  uint32 local_3c;
  uint32 local_38 [2];
  
  local_3c = 0;
  local_38[1] = 0;
  local_38[0] = n_rng;
  s3clr_fattr();
  s3add_fattr("version","1.2",1);
  s3add_fattr("chksum0","yes",1);
  fp = s3open(fn,"wb",(uint32 *)0x0);
  if (fp != (FILE *)0x0) {
    iVar1 = bio_fwrite(local_38,4,1,fp,0,&local_3c);
    if ((iVar1 == 1) && (iVar2 = bio_fwrite_1d(map,map_elem_size,n_dom,fp,&local_3c), -1 < iVar2)) {
      iVar1 = bio_fwrite(&local_3c,4,1,fp,0,local_38 + 1);
      s3close(fp);
      if (iVar1 != 1) {
        return -1;
      }
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3map_io.c"
              ,0xaa,"Wrote %s [%u mappings to %u]\n",fn,(ulong)n_dom,local_38[0]);
      return 0;
    }
    s3close(fp);
  }
  return -1;
}

Assistant:

int
s3map_write(const char *fn,
	    void *map,
	    uint32 n_dom,
	    uint32 n_rng,
	    size_t map_elem_size)
{
    FILE *fp;
    uint32 chksum = 0;
    uint32 ignore = 0;

    s3clr_fattr();
    s3add_fattr("version", MAP_FILE_VERSION, TRUE);
    s3add_fattr("chksum0", "yes", TRUE);

    fp = s3open(fn, "wb", NULL);
    if (fp == NULL)
	return S3_ERROR;

    if (bio_fwrite(&n_rng, sizeof(uint32), 1, fp, 0, &chksum) != 1) {
	s3close(fp);

	return S3_ERROR;
    }

    if (bio_fwrite_1d(map,
		   map_elem_size,
		   n_dom,
		   fp,
		   &chksum) < 0) {
	s3close(fp);

	return S3_ERROR;
    }

    if (bio_fwrite(&chksum, sizeof(uint32), 1, fp, 0, &ignore) != 1) {
	s3close(fp);

	return S3_ERROR;
    }

    s3close(fp);

    E_INFO("Wrote %s [%u mappings to %u]\n", fn, n_dom, n_rng);

    return S3_SUCCESS;
}